

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

void RangeEnc_FlushStream(CRangeEnc *p)

{
  long lVar1;
  long lVar2;
  long in_RDI;
  size_t num;
  
  if (*(int *)(in_RDI + 0x40) == 0) {
    lVar1 = *(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x28);
    lVar2 = (*(code *)**(undefined8 **)(in_RDI + 0x30))
                      (*(undefined8 *)(in_RDI + 0x30),*(undefined8 *)(in_RDI + 0x28),lVar1);
    if (lVar1 != lVar2) {
      *(undefined4 *)(in_RDI + 0x40) = 9;
    }
    *(long *)(in_RDI + 0x38) = lVar1 + *(long *)(in_RDI + 0x38);
    *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_RDI + 0x28);
  }
  return;
}

Assistant:

static void RangeEnc_FlushStream(CRangeEnc *p)
{
  size_t num;
  if (p->res != SZ_OK)
    return;
  num = p->buf - p->bufBase;
  if (num != p->outStream->Write(p->outStream, p->bufBase, num))
    p->res = SZ_ERROR_WRITE;
  p->processed += num;
  p->buf = p->bufBase;
}